

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_teamcity.hpp
# Opt level: O2

bool __thiscall
Catch::TeamCityReporter::assertionEnded(TeamCityReporter *this,AssertionStats *assertionStats)

{
  OfType OVar1;
  AssertionResult *this_00;
  long lVar2;
  ostream *poVar3;
  char *pcVar4;
  pointer pMVar5;
  pointer pMVar6;
  ostream *os;
  string local_b0;
  string local_90;
  AssertionResult *local_70;
  string local_68;
  ReusableStringStream msg;
  
  if ((((assertionStats->assertionResult).m_resultData.resultType & FailureBit) == Ok) ||
     (((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0))
  goto LAB_00139d52;
  ReusableStringStream::ReusableStringStream(&msg);
  os = msg.m_oss;
  if ((this->super_StreamingReporterBase<Catch::TeamCityReporter>).field_0x162 == '\0') {
    printSectionHeader(this,msg.m_oss);
  }
  (this->super_StreamingReporterBase<Catch::TeamCityReporter>).field_0x162 = 1;
  local_b0._M_dataplus._M_p = (assertionStats->assertionResult).m_info.lineInfo.file;
  local_b0._M_string_length = (assertionStats->assertionResult).m_info.lineInfo.line;
  Catch::operator<<(os,(SourceLineInfo *)&local_b0);
  std::operator<<((ostream *)os,"\n");
  OVar1 = (assertionStats->assertionResult).m_resultData.resultType;
  if (OVar1 == ExpressionFailed) {
    pcVar4 = "expression failed";
LAB_00139a3a:
    std::operator<<((ostream *)os,pcVar4);
  }
  else {
    if (OVar1 == ExplicitFailure) {
      pcVar4 = "explicit failure";
      goto LAB_00139a3a;
    }
    if (OVar1 == ThrewException) {
      pcVar4 = "unexpected exception";
      goto LAB_00139a3a;
    }
    if (OVar1 == DidntThrowException) {
      pcVar4 = "no exception was thrown where one was expected";
      goto LAB_00139a3a;
    }
    if (OVar1 == FatalErrorCondition) {
      pcVar4 = "fatal error condition";
      goto LAB_00139a3a;
    }
    if ((uint)OVar1 < 3) {
      ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_90);
      std::operator<<((ostream *)local_90.field_2._M_allocated_capacity,
                      "Internal error in TeamCity reporter");
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_b0);
    }
    if (((OVar1 == Unknown) || (OVar1 == FailureBit)) || (OVar1 == Exception)) {
      ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_90);
      std::operator<<((ostream *)local_90.field_2._M_allocated_capacity,"Not implemented");
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_b0);
    }
  }
  pMVar6 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar5 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar2 = (long)pMVar5 - (long)pMVar6;
  if (lVar2 == 0x48) {
    std::operator<<((ostream *)os," with message:");
    pMVar6 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar5 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar2 = (long)pMVar5 - (long)pMVar6;
  }
  if (1 < (ulong)(lVar2 / 0x48)) {
    std::operator<<((ostream *)os," with messages:");
    pMVar6 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar5 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  local_70 = &assertionStats->assertionResult;
  for (; pMVar6 != pMVar5; pMVar6 = pMVar6 + 1) {
    std::operator<<((ostream *)os,"\n  \"");
    std::operator<<((ostream *)os,(string *)&pMVar6->message);
    os = msg.m_oss;
    std::operator<<((ostream *)msg.m_oss,"\"");
  }
  if ((assertionStats->assertionResult).m_info.capturedExpression.m_size != 0) {
    std::operator<<((ostream *)os,"\n  ");
    this_00 = local_70;
    AssertionResult::getExpressionInMacro_abi_cxx11_(&local_b0,local_70);
    std::operator<<((ostream *)os,(string *)&local_b0);
    std::operator<<((ostream *)os,"\nwith expansion:\n");
    std::operator<<((ostream *)os,"  ");
    AssertionResult::getExpandedExpression_abi_cxx11_(&local_90,this_00);
    std::operator<<((ostream *)os,(string *)&local_90);
    std::operator<<((ostream *)os,"\n");
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  if ((((this->super_StreamingReporterBase<Catch::TeamCityReporter>).currentTestCaseInfo.
        super_Option<Catch::TestCaseInfo>.nullableValue)->properties & (MayFail|ShouldFail)) == None
     ) {
    poVar3 = std::operator<<((ostream *)
                             (this->super_StreamingReporterBase<Catch::TeamCityReporter>).stream,
                             "##teamcity[testFailed");
    poVar3 = std::operator<<(poVar3," name=\'");
    escape(&local_b0,
           &((this->super_StreamingReporterBase<Catch::TeamCityReporter>).currentTestCaseInfo.
             super_Option<Catch::TestCaseInfo>.nullableValue)->name);
    poVar3 = std::operator<<(poVar3,(string *)&local_b0);
    poVar3 = std::operator<<(poVar3,"\'");
    poVar3 = std::operator<<(poVar3," message=\'");
    std::__cxx11::stringbuf::str();
    escape(&local_90,&local_68);
    poVar3 = std::operator<<(poVar3,(string *)&local_90);
    poVar3 = std::operator<<(poVar3,"\'");
    std::operator<<(poVar3,"]\n");
  }
  else {
    std::operator<<((ostream *)msg.m_oss,"- failure ignore as test marked as \'ok to fail\'\n");
    poVar3 = std::operator<<((ostream *)
                             (this->super_StreamingReporterBase<Catch::TeamCityReporter>).stream,
                             "##teamcity[testIgnored");
    poVar3 = std::operator<<(poVar3," name=\'");
    escape(&local_b0,
           &((this->super_StreamingReporterBase<Catch::TeamCityReporter>).currentTestCaseInfo.
             super_Option<Catch::TestCaseInfo>.nullableValue)->name);
    poVar3 = std::operator<<(poVar3,(string *)&local_b0);
    poVar3 = std::operator<<(poVar3,"\'");
    poVar3 = std::operator<<(poVar3," message=\'");
    std::__cxx11::stringbuf::str();
    escape(&local_90,&local_68);
    poVar3 = std::operator<<(poVar3,(string *)&local_90);
    poVar3 = std::operator<<(poVar3,"\'");
    std::operator<<(poVar3,"]\n");
  }
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_b0);
  ReusableStringStream::~ReusableStringStream(&msg);
LAB_00139d52:
  std::ostream::flush();
  return true;
}

Assistant:

bool assertionEnded( AssertionStats const& assertionStats ) override {
            AssertionResult const& result = assertionStats.assertionResult;
            if( !result.isOk() ) {

                ReusableStringStream msg;
                if( !m_headerPrintedForThisSection )
                    printSectionHeader( msg.get() );
                m_headerPrintedForThisSection = true;

                msg << result.getSourceInfo() << "\n";

                switch( result.getResultType() ) {
                    case ResultWas::ExpressionFailed:
                        msg << "expression failed";
                        break;
                    case ResultWas::ThrewException:
                        msg << "unexpected exception";
                        break;
                    case ResultWas::FatalErrorCondition:
                        msg << "fatal error condition";
                        break;
                    case ResultWas::DidntThrowException:
                        msg << "no exception was thrown where one was expected";
                        break;
                    case ResultWas::ExplicitFailure:
                        msg << "explicit failure";
                        break;

                    // We shouldn't get here because of the isOk() test
                    case ResultWas::Ok:
                    case ResultWas::Info:
                    case ResultWas::Warning:
                        CATCH_ERROR( "Internal error in TeamCity reporter" );
                    // These cases are here to prevent compiler warnings
                    case ResultWas::Unknown:
                    case ResultWas::FailureBit:
                    case ResultWas::Exception:
                        CATCH_ERROR( "Not implemented" );
                }
                if( assertionStats.infoMessages.size() == 1 )
                    msg << " with message:";
                if( assertionStats.infoMessages.size() > 1 )
                    msg << " with messages:";
                for( auto const& messageInfo : assertionStats.infoMessages )
                    msg << "\n  \"" << messageInfo.message << "\"";


                if( result.hasExpression() ) {
                    msg <<
                        "\n  " << result.getExpressionInMacro() << "\n"
                        "with expansion:\n" <<
                        "  " << result.getExpandedExpression() << "\n";
                }

                if( currentTestCaseInfo->okToFail() ) {
                    msg << "- failure ignore as test marked as 'ok to fail'\n";
                    stream << "##teamcity[testIgnored"
                           << " name='" << escape( currentTestCaseInfo->name )<< "'"
                           << " message='" << escape( msg.str() ) << "'"
                           << "]\n";
                }
                else {
                    stream << "##teamcity[testFailed"
                           << " name='" << escape( currentTestCaseInfo->name )<< "'"
                           << " message='" << escape( msg.str() ) << "'"
                           << "]\n";
                }
            }
            stream.flush();
            return true;
        }